

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreSimplify.cpp
# Opt level: O1

void mathCore::combine_generics(expression *a,_func_bool_expression_ptr *typeFunction)

{
  expression *this;
  bool bVar1;
  iterator __position;
  _Self __tmp;
  _Rb_tree_header *p_Var2;
  expSet temp_set;
  _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar1 = (*typeFunction)(a);
  if (bVar1) {
    __position._M_node = (a->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var2 = &(a->contents)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)__position._M_node != p_Var2) {
      do {
        bVar1 = (*typeFunction)(*(expression **)(__position._M_node + 1));
        if (bVar1) {
          bVar1 = is_negated(*(expression **)(__position._M_node + 1));
          if (bVar1) goto LAB_00107e01;
          bVar1 = is_dualed(*(expression **)(__position._M_node + 1));
          if (bVar1) goto LAB_00107e01;
          mergeMultiSet((expSet *)&local_60,(expSet *)(*(long *)(__position._M_node + 1) + 8));
          std::
          _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
          ::clear((_Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
                   *)(*(long *)(__position._M_node + 1) + 8));
          this = *(expression **)(__position._M_node + 1);
          if (this != (expression *)0x0) {
            expression::~expression(this);
            operator_delete(this);
          }
          __position = std::
                       _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                       ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                                           *)&a->contents,__position._M_node);
        }
        else {
LAB_00107e01:
          __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
          if ((_Rb_tree_header *)__position._M_node != p_Var2) {
            bVar1 = is_var(*(expression **)(__position._M_node + 1));
            if (!bVar1) {
              bVar1 = is_literal(*(expression **)(__position._M_node + 1));
              if (!bVar1) goto LAB_00107e74;
            }
            __position._M_node = &p_Var2->_M_header;
          }
        }
LAB_00107e74:
      } while ((_Rb_tree_header *)__position._M_node != p_Var2);
    }
    mergeMultiSet(&a->contents,(expSet *)&local_60);
  }
  std::
  _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void mathCore::combine_generics(expression * a, bool(*typeFunction)(expression*)) {
	expSet temp_set; // Temporary Storage for new elements


													  // If our children are the same typefunction as ourselves
													  // we merge them into ourselves, which is a feature from C++17!

	if ((*typeFunction)(a)) {
		auto iter = a->contents.begin();
		while (iter != a->contents.end()) {
			// They need to be the same type as us and also not be negated or dualed!
			if ((*typeFunction)(*iter) && !(mathCore::is_negated(*iter) || mathCore::is_dualed(*iter))) {
				/*
				MSVC Does not support this, thats really sad, so we have to build our own merge function!
				a->contents.merge(child->contents);
				*/
				mergeMultiSet(temp_set, (*iter)->contents);
				(*iter)->contents.clear(); // Clearing first before deleting it to prevent recursive deletion
				delete (*iter);

				// Erase returns the next iter, since deleting things invalidates it
				iter = a->contents.erase(iter);
			}
			else {
				iter++;
				// Slight Optimization: All variable expressions have 0 uuid, so they must be at the beginning!
				if (iter != a->contents.end()) {
					if (mathCore::is_var(*iter) || mathCore::is_literal(*iter)) {
						iter = a->contents.end();
					}
				}
			}
		}
		// Finally merge everything we just found into the parent
		mergeMultiSet(a->contents, temp_set);
	}
}